

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_false,_false>::unfix_
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  int *piVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  ulong uVar5;
  uint block_pos;
  
  block_pos = node_pos >> 8;
  pBVar3 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (*(int *)((long)&pBVar3->num_emps + (ulong)(block_pos << 4)) == 0) {
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[node_pos] =
         (Bc)((ulong)pBVar4[node_pos] & 0xffffffff00000000 | (ulong)(node_pos & 0x7fffffff));
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[node_pos] =
         (Bc)((ulong)pBVar4[node_pos] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20)
    ;
    *(uint32_t *)
     ((long)&((blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
              super__Vector_impl_data._M_start)->head + (ulong)(block_pos << 4)) = node_pos;
    insert_block_link_(this,block_pos,blocks);
  }
  else {
    uVar2 = *(uint *)((long)&pBVar3->head + (ulong)(block_pos << 4));
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[node_pos] =
         (Bc)((ulong)pBVar4[node_pos] & 0x80000000ffffffff |
             (ulong)pBVar4[uVar2] & 0x7fffffff00000000);
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[node_pos] =
         (Bc)((ulong)(uVar2 & 0x7fffffff) | (ulong)pBVar4[node_pos] & 0xffffffff00000000);
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (ulong)pBVar4[uVar2] >> 0x1d & 0x3fffffff8;
    *(ulong *)(&pBVar4->field_0x0 + uVar5) =
         *(ulong *)(&pBVar4->field_0x0 + uVar5) & 0xffffffff00000000 |
         (ulong)(node_pos & 0x7fffffff);
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar4[uVar2] =
         (Bc)((ulong)pBVar4[uVar2] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20);
  }
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar4 = (Bc)((ulong)*pBVar4 & 0x7fffffffffffffff);
  this->bc_emps_ = this->bc_emps_ + 1;
  piVar1 = (int *)((long)&((blocks->
                           super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                           _M_impl.super__Vector_impl_data._M_start)->num_emps +
                  (ulong)(block_pos << 4));
  *piVar1 = *piVar1 + 1;
  if (block_pos ==
      (int)((ulong)((long)(this->blocks_).
                          super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->blocks_).
                         super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 4) - 1U) {
    do {
      if ((blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
          super__Vector_impl_data._M_start[block_pos].num_emps != 0x100) {
        return;
      }
      pop_block_(this);
      block_pos = block_pos - 1;
    } while ((int)((ulong)((long)(this->blocks_).
                                 super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->blocks_).
                                super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 4) != 0);
  }
  return;
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (blocks[block_pos].num_emps == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      blocks[block_pos].head = node_pos;
      insert_block_link_(block_pos, blocks);
    } else {
      auto head = blocks[block_pos].head;
      set_prev_(node_pos, prev_(head));
      set_next_(node_pos, head);
      set_next_(prev_(head), node_pos);
      set_prev_(head, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }